

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

boolean inside_region(region *reg,int x,int y)

{
  ushort uVar1;
  boolean bVar2;
  long lVar3;
  
  if (reg == (region *)0x0) {
    bVar2 = '\0';
  }
  else {
    bVar2 = inside_rect(&reg->bounding_box,x,y);
    lVar3 = 0;
    if (bVar2 != '\0') {
      uVar1 = reg->nrects;
      if ((short)uVar1 < 1) {
        uVar1 = 0;
      }
      do {
        if ((ulong)uVar1 * 4 + 4 == lVar3 + 4) {
          lVar3 = 0;
          goto LAB_00222d84;
        }
        bVar2 = inside_rect((nhrect *)(&reg->rects->lx + lVar3),x,y);
        lVar3 = lVar3 + 4;
      } while (bVar2 == '\0');
      lVar3 = 1;
    }
LAB_00222d84:
    bVar2 = (boolean)lVar3;
  }
  return bVar2;
}

Assistant:

static boolean inside_region(struct region *reg, int x, int y)
{
    int i;

    if (reg == NULL || !inside_rect(&(reg->bounding_box), x, y))
	return FALSE;
    for (i = 0; i < reg->nrects; i++)
	if (inside_rect(&(reg->rects[i]), x, y))
	    return TRUE;
    return FALSE;
}